

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void open_loop_cb(uv_fs_t *req)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_fs_t *loop;
  char *pcVar3;
  uv_file add_flags;
  int add_flags_00;
  uv_fs_t *puVar4;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_dirent_t *unaff_R15;
  uv_buf_t uVar5;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_dirent_t uStackY_e0;
  uv_loop_t *puStackY_d0;
  char *pcStackY_c8;
  uv_fs_t *puStackY_b8;
  code *pcStackY_b0;
  code *pcStackY_a8;
  uv_dirent_t uStackY_a0;
  char *pcStackY_90;
  
  if (req->fs_type == UV_FS_OPEN) {
    if (req->result == -0x28) {
      open_cb_count = open_cb_count + 1;
      uv_fs_req_cleanup(req);
      return;
    }
  }
  else {
    open_loop_cb_cold_1();
  }
  open_loop_cb_cold_2();
  unlink("test_file");
  unlink("test_file2");
  puVar2 = uv_default_loop();
  ::loop = puVar2;
  iVar1 = uv_fs_open(puVar2,&open_req1,"test_file",0x41,0x180,create_cb);
  if (iVar1 == 0) {
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (create_cb_count != 1) goto LAB_0015050f;
    if (write_cb_count != 1) goto LAB_00150514;
    if (fsync_cb_count != 1) goto LAB_00150519;
    if (fdatasync_cb_count != 1) goto LAB_0015051e;
    if (close_cb_count != 1) goto LAB_00150523;
    puVar2 = ::loop;
    iVar1 = uv_fs_rename(::loop,&rename_req,"test_file","test_file2",rename_cb);
    if (iVar1 != 0) goto LAB_00150528;
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (create_cb_count != 1) goto LAB_0015052d;
    if (write_cb_count != 1) goto LAB_00150532;
    if (close_cb_count != 1) goto LAB_00150537;
    if (rename_cb_count != 1) goto LAB_0015053c;
    puVar2 = ::loop;
    iVar1 = uv_fs_open(::loop,&open_req1,"test_file2",2,0,open_cb);
    if (iVar1 != 0) goto LAB_00150541;
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (open_cb_count != 1) goto LAB_00150546;
    if (read_cb_count != 1) goto LAB_0015054b;
    if (close_cb_count != 2) goto LAB_00150550;
    if (rename_cb_count != 1) goto LAB_00150555;
    if (create_cb_count != 1) goto LAB_0015055a;
    if (write_cb_count != 1) goto LAB_0015055f;
    if (ftruncate_cb_count != 1) goto LAB_00150564;
    puVar2 = ::loop;
    iVar1 = uv_fs_open(::loop,&open_req1,"test_file2",0,0,open_cb);
    if (iVar1 != 0) goto LAB_00150569;
    puVar2 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (open_cb_count != 2) goto LAB_0015056e;
    if (read_cb_count != 2) goto LAB_00150573;
    if (close_cb_count != 3) goto LAB_00150578;
    if (rename_cb_count != 1) goto LAB_0015057d;
    if (unlink_cb_count != 1) goto LAB_00150582;
    if (create_cb_count != 1) goto LAB_00150587;
    if (write_cb_count != 1) goto LAB_0015058c;
    if (ftruncate_cb_count != 1) goto LAB_00150591;
    unlink("test_file");
    unlink("test_file2");
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_fs_file_async_cold_1();
LAB_0015050f:
    run_test_fs_file_async_cold_2();
LAB_00150514:
    run_test_fs_file_async_cold_3();
LAB_00150519:
    run_test_fs_file_async_cold_4();
LAB_0015051e:
    run_test_fs_file_async_cold_5();
LAB_00150523:
    run_test_fs_file_async_cold_6();
LAB_00150528:
    run_test_fs_file_async_cold_7();
LAB_0015052d:
    run_test_fs_file_async_cold_8();
LAB_00150532:
    run_test_fs_file_async_cold_9();
LAB_00150537:
    run_test_fs_file_async_cold_10();
LAB_0015053c:
    run_test_fs_file_async_cold_11();
LAB_00150541:
    run_test_fs_file_async_cold_12();
LAB_00150546:
    run_test_fs_file_async_cold_13();
LAB_0015054b:
    run_test_fs_file_async_cold_14();
LAB_00150550:
    run_test_fs_file_async_cold_15();
LAB_00150555:
    run_test_fs_file_async_cold_16();
LAB_0015055a:
    run_test_fs_file_async_cold_17();
LAB_0015055f:
    run_test_fs_file_async_cold_18();
LAB_00150564:
    run_test_fs_file_async_cold_19();
LAB_00150569:
    run_test_fs_file_async_cold_20();
LAB_0015056e:
    run_test_fs_file_async_cold_21();
LAB_00150573:
    run_test_fs_file_async_cold_22();
LAB_00150578:
    run_test_fs_file_async_cold_23();
LAB_0015057d:
    run_test_fs_file_async_cold_24();
LAB_00150582:
    run_test_fs_file_async_cold_25();
LAB_00150587:
    run_test_fs_file_async_cold_26();
LAB_0015058c:
    run_test_fs_file_async_cold_27();
LAB_00150591:
    run_test_fs_file_async_cold_28();
  }
  run_test_fs_file_async_cold_29();
  if (puVar2 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_00150633;
    if (open_req1.result._4_4_ < 0) goto LAB_00150638;
    create_cb_count = create_cb_count + 1;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    puVar2 = ::loop;
    iVar1 = uv_fs_write(::loop,&write_req,(uv_file)open_req1.result,&iov,1,-1,write_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    create_cb_cold_1();
LAB_00150633:
    create_cb_cold_2();
LAB_00150638:
    create_cb_cold_3();
  }
  create_cb_cold_4();
  if (puVar2 == (uv_loop_t *)&rename_req) {
    if (rename_req.fs_type != UV_FS_RENAME) goto LAB_0015067a;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      uv_fs_req_cleanup(&rename_req);
      return;
    }
  }
  else {
    rename_cb_cold_1();
LAB_0015067a:
    rename_cb_cold_2();
  }
  rename_cb_cold_3();
  if (puVar2 == (uv_loop_t *)&open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_0015076b;
    add_flags = (uv_file)open_req1.result;
    if (open_req1.result._4_4_ < 0) goto LAB_00150770;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_00150775;
    if (*(long *)(open_req1.path + 3) != 0x32656c69665f74 ||
        *(long *)open_req1.path != 0x6c69665f74736574) goto LAB_0015077a;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar5 = uv_buf_init(buf,0x20);
    puVar2 = ::loop;
    iov = uVar5;
    iVar1 = uv_fs_read(::loop,&read_req,(uv_file)open_req1.result,&iov,1,-1,read_cb);
    add_flags = (uv_file)puVar2;
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    open_cb_cold_1();
LAB_0015076b:
    add_flags = (uv_file)puVar2;
    open_cb_cold_2();
LAB_00150770:
    open_cb_cold_6();
LAB_00150775:
    open_cb_cold_5();
LAB_0015077a:
    open_cb_cold_3();
  }
  open_cb_cold_4();
  fs_file_sync(add_flags);
  fs_file_sync(add_flags);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return;
  }
  run_test_fs_file_sync_cold_1();
  unlink("test_file");
  unlink("test_file2");
  puVar2 = uv_default_loop();
  ::loop = puVar2;
  iVar1 = uv_fs_open(puVar2,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  add_flags_00 = (int)puVar2;
  if (iVar1 < 0) {
    fs_file_sync_cold_1();
LAB_00150bd3:
    fs_file_sync_cold_2();
LAB_00150bd8:
    fs_file_sync_cold_3();
LAB_00150bdd:
    fs_file_sync_cold_4();
LAB_00150be2:
    fs_file_sync_cold_5();
LAB_00150be7:
    fs_file_sync_cold_6();
LAB_00150bec:
    fs_file_sync_cold_7();
LAB_00150bf1:
    fs_file_sync_cold_8();
LAB_00150bf6:
    fs_file_sync_cold_9();
LAB_00150bfb:
    fs_file_sync_cold_10();
LAB_00150c00:
    fs_file_sync_cold_11();
LAB_00150c05:
    fs_file_sync_cold_12();
LAB_00150c0a:
    fs_file_sync_cold_13();
LAB_00150c0f:
    fs_file_sync_cold_14();
LAB_00150c14:
    fs_file_sync_cold_15();
LAB_00150c19:
    fs_file_sync_cold_16();
LAB_00150c1e:
    fs_file_sync_cold_17();
LAB_00150c23:
    fs_file_sync_cold_18();
LAB_00150c28:
    fs_file_sync_cold_19();
LAB_00150c2d:
    fs_file_sync_cold_20();
LAB_00150c32:
    fs_file_sync_cold_21();
LAB_00150c37:
    fs_file_sync_cold_22();
LAB_00150c3c:
    fs_file_sync_cold_23();
LAB_00150c41:
    fs_file_sync_cold_24();
LAB_00150c46:
    fs_file_sync_cold_25();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00150bd3;
    uv_fs_req_cleanup(&open_req1);
    uVar5 = uv_buf_init(test_buf,0xd);
    add_flags_00 = 0;
    iov = uVar5;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00150bd8;
    if (write_req.result < 0) goto LAB_00150bdd;
    uv_fs_req_cleanup(&write_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150be2;
    if (close_req.result != 0) goto LAB_00150be7;
    uv_fs_req_cleanup(&close_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",2,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00150bec;
    if (open_req1.result._4_4_ < 0) goto LAB_00150bf1;
    uv_fs_req_cleanup(&open_req1);
    uVar5 = uv_buf_init(buf,0x20);
    add_flags_00 = 0;
    iov = uVar5;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_00150bf6;
    if (read_req.result < 0) goto LAB_00150bfb;
    add_flags_00 = 0x2fbca0;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00150c00;
    uv_fs_req_cleanup(&read_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_ftruncate((uv_loop_t *)0x0,&ftruncate_req,(uv_file)open_req1.result,7,
                            (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150c05;
    if (ftruncate_req.result != 0) goto LAB_00150c0a;
    uv_fs_req_cleanup(&ftruncate_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150c0f;
    if (close_req.result != 0) goto LAB_00150c14;
    uv_fs_req_cleanup(&close_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150c19;
    if (rename_req.result != 0) goto LAB_00150c1e;
    uv_fs_req_cleanup(&rename_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00150c23;
    if (open_req1.result._4_4_ < 0) goto LAB_00150c28;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar5 = uv_buf_init(buf,0x20);
    add_flags_00 = 0;
    iov = uVar5;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_00150c2d;
    if (read_req.result < 0) goto LAB_00150c32;
    if (buf._0_8_ != 0x75622d74736574) goto LAB_00150c37;
    uv_fs_req_cleanup(&read_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150c3c;
    if (close_req.result != 0) goto LAB_00150c41;
    uv_fs_req_cleanup(&close_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_unlink((uv_loop_t *)0x0,&unlink_req,"test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150c46;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      unlink("test_file2");
      return;
    }
  }
  fs_file_sync_cold_26();
  fs_file_write_null_buffer(add_flags_00);
  fs_file_write_null_buffer(add_flags_00);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  ::loop = uv_default_loop();
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_00150da0:
    fs_file_write_null_buffer_cold_2();
LAB_00150da5:
    fs_file_write_null_buffer_cold_3();
LAB_00150daa:
    fs_file_write_null_buffer_cold_4();
LAB_00150daf:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00150da0;
    uv_fs_req_cleanup(&open_req1);
    uVar5 = uv_buf_init((char *)0x0,0);
    iov = uVar5;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150da5;
    if (write_req.result != 0) goto LAB_00150daa;
    uv_fs_req_cleanup(&write_req);
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150daf;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStackY_90 = "test_file";
  pcStackY_a8 = (code *)0x150dd2;
  unlink("test_dir/file1");
  pcStackY_a8 = (code *)0x150dde;
  unlink("test_dir/file2");
  puVar2 = (uv_loop_t *)0x194447;
  pcStackY_a8 = (code *)0x150ded;
  rmdir("test_dir");
  pcStackY_a8 = (code *)0x150df2;
  loop = (uv_fs_t *)uv_default_loop();
  pcStackY_a8 = (code *)0x150e17;
  ::loop = (uv_loop_t *)loop;
  iVar1 = uv_fs_mkdir((uv_loop_t *)loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStackY_a8 = (code *)0x150e2d;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_00151235;
    loop = (uv_fs_t *)0x0;
    pcStackY_a8 = (code *)0x150e5d;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_0015123a;
    pcStackY_a8 = (code *)0x150e71;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_a8 = (code *)0x150e87;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0015123f;
    pcStackY_a8 = (code *)0x150e9b;
    uv_fs_req_cleanup(&close_req);
    loop = (uv_fs_t *)0x0;
    pcStackY_a8 = (code *)0x150ebe;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00151244;
    pcStackY_a8 = (code *)0x150ed2;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_a8 = (code *)0x150ee8;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00151249;
    pcStackY_a8 = (code *)0x150efc;
    uv_fs_req_cleanup(&close_req);
    pcStackY_a8 = (code *)0x150f1f;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_scandir(::loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_0015124e;
    pcStackY_a8 = (code *)0x150f35;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_00151253;
    loop = (uv_fs_t *)0x0;
    pcStackY_a8 = (code *)0x150f5c;
    iVar1 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir",0,(uv_fs_cb)0x0);
    if (iVar1 != 2) goto LAB_00151258;
    if (scandir_req.result != 2) goto LAB_0015125d;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00151262;
    pcStackY_a8 = (code *)0x150f90;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_a0);
    if (iVar1 != -0xfff) {
      puVar2 = (uv_loop_t *)0x192f38;
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        loop = (uv_fs_t *)uStackY_a0.name;
        pcVar3 = "file1";
        pcStackY_a8 = (code *)0x150fbe;
        iVar1 = strcmp(uStackY_a0.name,"file1");
        if (iVar1 != 0) {
          pcVar3 = "file2";
          pcStackY_a8 = (code *)0x150fcd;
          iVar1 = strcmp((char *)loop,"file2");
          if (iVar1 != 0) {
            pcStackY_a8 = (code *)0x151230;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &uStackY_a0;
            goto LAB_00151230;
          }
        }
        dent.name = (char *)(ulong)uStackY_a0.type;
        pcStackY_a8 = (code *)0x150fde;
        dent._8_8_ = pcVar3;
        assert_is_file_type(dent);
        pcStackY_a8 = (code *)0x150fe9;
        iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_a0);
        unaff_R15 = &uStackY_a0;
      } while (iVar1 != -0xfff);
    }
    loop = &scandir_req;
    pcStackY_a8 = (code *)0x150ffc;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) goto LAB_00151267;
    pcStackY_a8 = (code *)0x15102b;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_0015126c;
    pcStackY_a8 = (code *)0x151041;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_a8 = (code *)0x151062;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00151271;
    pcStackY_a8 = (code *)0x151078;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_a8 = (code *)0x151099;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00151276;
    pcStackY_a8 = (code *)0x1510af;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_a8 = (code *)0x1510d0;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_0015127b;
    pcStackY_a8 = (code *)0x1510e6;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (stat_cb_count != 4) goto LAB_00151280;
    pcStackY_a8 = (code *)0x151114;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_00151285;
    pcStackY_a8 = (code *)0x15112a;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 1) goto LAB_0015128a;
    pcStackY_a8 = (code *)0x151158;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_0015128f;
    pcStackY_a8 = (code *)0x15116e;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 2) goto LAB_00151294;
    pcStackY_a8 = (code *)0x15119c;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_rmdir(::loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_00151299;
    pcStackY_a8 = (code *)0x1511b2;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (rmdir_cb_count != 1) goto LAB_0015129e;
    pcStackY_a8 = (code *)0x1511cb;
    unlink("test_dir/file1");
    pcStackY_a8 = (code *)0x1511d7;
    unlink("test_dir/file2");
    pcStackY_a8 = (code *)0x1511e3;
    rmdir("test_dir");
    pcStackY_a8 = (code *)0x1511e8;
    puVar2 = uv_default_loop();
    pcStackY_a8 = (code *)0x1511fc;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStackY_a8 = (code *)0x151206;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStackY_a8 = (code *)0x15120b;
    loop = (uv_fs_t *)uv_default_loop();
    pcStackY_a8 = (code *)0x151213;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
LAB_00151230:
    pcStackY_a8 = (code *)0x151235;
    run_test_fs_async_dir_cold_1();
LAB_00151235:
    pcStackY_a8 = (code *)0x15123a;
    run_test_fs_async_dir_cold_2();
LAB_0015123a:
    pcStackY_a8 = (code *)0x15123f;
    run_test_fs_async_dir_cold_3();
LAB_0015123f:
    pcStackY_a8 = (code *)0x151244;
    run_test_fs_async_dir_cold_4();
LAB_00151244:
    pcStackY_a8 = (code *)0x151249;
    run_test_fs_async_dir_cold_5();
LAB_00151249:
    pcStackY_a8 = (code *)0x15124e;
    run_test_fs_async_dir_cold_6();
LAB_0015124e:
    pcStackY_a8 = (code *)0x151253;
    run_test_fs_async_dir_cold_7();
LAB_00151253:
    pcStackY_a8 = (code *)0x151258;
    run_test_fs_async_dir_cold_8();
LAB_00151258:
    pcStackY_a8 = (code *)0x15125d;
    run_test_fs_async_dir_cold_9();
LAB_0015125d:
    pcStackY_a8 = (code *)0x151262;
    run_test_fs_async_dir_cold_10();
LAB_00151262:
    pcStackY_a8 = (code *)0x151267;
    run_test_fs_async_dir_cold_25();
LAB_00151267:
    pcStackY_a8 = (code *)0x15126c;
    run_test_fs_async_dir_cold_12();
LAB_0015126c:
    pcStackY_a8 = (code *)0x151271;
    run_test_fs_async_dir_cold_13();
LAB_00151271:
    pcStackY_a8 = (code *)0x151276;
    run_test_fs_async_dir_cold_14();
LAB_00151276:
    pcStackY_a8 = (code *)0x15127b;
    run_test_fs_async_dir_cold_15();
LAB_0015127b:
    pcStackY_a8 = (code *)0x151280;
    run_test_fs_async_dir_cold_16();
LAB_00151280:
    pcStackY_a8 = (code *)0x151285;
    run_test_fs_async_dir_cold_17();
LAB_00151285:
    pcStackY_a8 = (code *)0x15128a;
    run_test_fs_async_dir_cold_18();
LAB_0015128a:
    pcStackY_a8 = (code *)0x15128f;
    run_test_fs_async_dir_cold_19();
LAB_0015128f:
    pcStackY_a8 = (code *)0x151294;
    run_test_fs_async_dir_cold_20();
LAB_00151294:
    pcStackY_a8 = (code *)0x151299;
    run_test_fs_async_dir_cold_21();
LAB_00151299:
    pcStackY_a8 = (code *)0x15129e;
    run_test_fs_async_dir_cold_22();
LAB_0015129e:
    pcStackY_a8 = (code *)0x1512a3;
    run_test_fs_async_dir_cold_23();
  }
  pcStackY_a8 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (loop == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_00151302;
    if (mkdir_req.result != 0) goto LAB_00151307;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_0015130c;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return;
    }
  }
  else {
    pcStackY_b0 = (code *)0x151302;
    mkdir_cb_cold_1();
LAB_00151302:
    pcStackY_b0 = (code *)0x151307;
    mkdir_cb_cold_2();
LAB_00151307:
    pcStackY_b0 = (code *)0x15130c;
    mkdir_cb_cold_3();
LAB_0015130c:
    pcStackY_b0 = (code *)0x151311;
    mkdir_cb_cold_5();
  }
  pcStackY_b0 = scandir_cb;
  mkdir_cb_cold_4();
  puStackY_d0 = puVar2;
  pcStackY_c8 = unaff_R12;
  puStackY_b8 = unaff_R14;
  pcStackY_b0 = (code *)unaff_R15;
  if (loop == &scandir_req) {
    puVar4 = loop;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015141d;
    if (scandir_req.result != 2) goto LAB_00151422;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00151427;
    puVar4 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_e0);
    loop = (uv_fs_t *)uStackY_e0.name;
    while (iVar1 != -0xfff) {
      pcVar3 = "file1";
      uStackY_e0.name = (char *)loop;
      iVar1 = strcmp((char *)loop,"file1");
      if (iVar1 != 0) {
        pcVar3 = "file2";
        iVar1 = strcmp((char *)loop,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00151418;
        }
      }
      dent_00.name = (char *)(ulong)uStackY_e0.type;
      dent_00._8_8_ = pcVar3;
      assert_is_file_type(dent_00);
      puVar4 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_e0);
      loop = (uv_fs_t *)uStackY_e0.name;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_0015142c;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_00151431;
    puVar4 = &scandir_req;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
LAB_00151418:
    scandir_cb_cold_1();
    puVar4 = loop;
LAB_0015141d:
    scandir_cb_cold_2();
LAB_00151422:
    scandir_cb_cold_3();
LAB_00151427:
    scandir_cb_cold_8();
LAB_0015142c:
    scandir_cb_cold_7();
LAB_00151431:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar4 < 2) {
    return;
  }
  assert_is_file_type_cold_1();
  if (puVar4 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_00151499;
    if (stat_req.result != 0) goto LAB_0015149e;
    if (stat_req.ptr == (void *)0x0) goto LAB_001514a3;
    stat_cb_count = stat_cb_count + 1;
    puVar4 = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_00151499:
    stat_cb_cold_2();
LAB_0015149e:
    stat_cb_cold_3();
LAB_001514a3:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar4 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_001514e5;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_001514e5:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar4 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00151549;
    if (rmdir_req.result != 0) goto LAB_0015154e;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_00151558;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00151549:
    rmdir_cb_cold_2();
LAB_0015154e:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00151558:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return;
}

Assistant:

static void open_loop_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_OPEN);
  ASSERT(req->result == UV_ELOOP);
  open_cb_count++;
  uv_fs_req_cleanup(req);
}